

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_useek(htsFile *fp,long uoffset,int where)

{
  int where_local;
  long uoffset_local;
  htsFile *fp_local;
  
  if (((undefined1  [96])*fp & (undefined1  [96])0x1) == (undefined1  [96])0x0) {
    ((fp->fp).bgzf)->cache_size = 0;
    *(undefined4 *)(fp->fp).bgzf = 0;
    ((fp->fp).bgzf)->block_length = ((fp->fp).bgzf)->block_length & 0xfffffffc;
    ((fp->fp).bgzf)->block_address = uoffset;
    fp_local._4_4_ = bgzf_useek((BGZF *)((fp->fp).cram)->header,uoffset,where);
  }
  else {
    fp_local._4_4_ = bgzf_useek((fp->fp).bgzf,uoffset,where);
  }
  return fp_local._4_4_;
}

Assistant:

int hts_useek(htsFile *fp, long uoffset, int where)
{
    if ( fp->is_bin )
        return bgzf_useek(fp->fp.bgzf, uoffset, where);
    else
    {
        ks_rewind((kstream_t*)fp->fp.voidp);
        ((kstream_t*)fp->fp.voidp)->seek_pos = uoffset;
        return bgzf_useek(((kstream_t*)fp->fp.voidp)->f, uoffset, where);
    }
}